

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O2

TestCaseGroup * deqp::gles3::Functional::createLifetimeTests(Context *context)

{
  TestCaseGroup *this;
  
  this = (TestCaseGroup *)operator_new(0x88);
  TestCaseGroup::TestCaseGroup(this,context,"lifetime","Object lifetime tests");
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestGroup_01e29168
  ;
  this[1].super_TestCaseGroup.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  return this;
}

Assistant:

TestCaseGroup* createLifetimeTests (Context& context)
{
	return new TestGroup(context);
}